

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O3

bool Transporter::ParseSocketAddress(string *host,int port,sockaddr_storage *addr,string *err)

{
  char *hostname;
  uint uVar1;
  int err_00;
  uv_loop_t *loop;
  uint uVar2;
  ulong uVar3;
  uint __val;
  uint __len;
  string __str;
  uv_getaddrinfo_t resolver;
  char *local_f0 [2];
  char local_e0 [16];
  uv_getaddrinfo_t local_d0;
  
  loop = uv_default_loop();
  hostname = (host->_M_dataplus)._M_p;
  __val = -port;
  if (0 < port) {
    __val = port;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar2 = (uint)uVar3;
      if (uVar2 < 100) {
        __len = __len - 2;
        goto LAB_0013963b;
      }
      if (uVar2 < 1000) {
        __len = __len - 1;
        goto LAB_0013963b;
      }
      if (uVar2 < 10000) goto LAB_0013963b;
      uVar3 = uVar3 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar2);
    __len = __len + 1;
  }
LAB_0013963b:
  local_f0[0] = local_e0;
  std::__cxx11::string::_M_construct((ulong)local_f0,(char)__len - (char)(port >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_f0[0] + ((uint)port >> 0x1f),__len,__val);
  err_00 = uv_getaddrinfo(loop,&local_d0,(uv_getaddrinfo_cb)0x0,hostname,local_f0[0],(addrinfo *)0x0
                         );
  if (local_f0[0] != local_e0) {
    operator_delete(local_f0[0]);
  }
  if (err_00 == 0) {
    memcpy(addr,(local_d0.addrinfo)->ai_addr,(ulong)(local_d0.addrinfo)->ai_addrlen);
    uv_freeaddrinfo(local_d0.addrinfo);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)err,0,(char *)err->_M_string_length,0x163cec);
    uv_strerror(err_00);
    std::__cxx11::string::append((char *)err);
  }
  return err_00 == 0;
}

Assistant:

bool Transporter::ParseSocketAddress(const std::string &host, int port, sockaddr_storage *addr, std::string &err) 
{
	auto const loop = uv_default_loop();
	uv_getaddrinfo_t resolver;
	int res = uv_getaddrinfo(loop, &resolver, nullptr, host.c_str(),
	                         std::to_string(port).c_str(), nullptr);
	if (res != 0) {
		err = "Invalid host: ";
		err += uv_strerror(res);
		return false;
	}
	memcpy(addr, resolver.addrinfo->ai_addr, resolver.addrinfo->ai_addrlen);
	uv_freeaddrinfo(resolver.addrinfo);
	return true;
}